

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

BIT_DStream_status BIT_reloadDStream(BIT_DStream_t *bitD)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t *psVar4;
  ulong uVar5;
  
  uVar1 = bitD->bitsConsumed;
  if (0x40 < uVar1) {
    return BIT_DStream_overflow;
  }
  pcVar2 = bitD->ptr;
  if (pcVar2 < bitD->limitPtr) {
    pcVar3 = bitD->start;
    if (pcVar2 != pcVar3) {
      uVar5 = (ulong)(uint)((int)pcVar2 - (int)pcVar3);
      if (pcVar2 + -(ulong)(uVar1 >> 3) >= pcVar3) {
        uVar5 = (ulong)(uVar1 >> 3);
      }
      bitD->ptr = pcVar2 + -uVar5;
      bitD->bitsConsumed = uVar1 + (int)uVar5 * -8;
      bitD->bitContainer = *(size_t *)(pcVar2 + -uVar5);
      return (BIT_DStream_status)(pcVar2 + -(ulong)(uVar1 >> 3) < pcVar3);
    }
    return (uVar1 == 0x40) + BIT_DStream_endOfBuffer;
  }
  if (bitD->ptr < bitD->limitPtr) {
    return BIT_DStream_overflow;
  }
  uVar1 = bitD->bitsConsumed;
  if (uVar1 < 0x41) {
    psVar4 = (size_t *)(bitD->ptr + -(ulong)(uVar1 >> 3));
    bitD->ptr = (char *)psVar4;
    bitD->bitsConsumed = uVar1 & 7;
    bitD->bitContainer = *psVar4;
    return BIT_DStream_unfinished;
  }
  __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x6a8,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        return BIT_reloadDStreamFast(bitD);
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}